

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

xmlChar * xmlStrcat(xmlChar *cur,xmlChar *add)

{
  long lVar1;
  xmlChar *pxVar2;
  long lVar3;
  ulong __n;
  
  if (add != (xmlChar *)0x0) {
    if (cur != (xmlChar *)0x0) {
      lVar3 = 0;
      do {
        pxVar2 = add + lVar3;
        lVar3 = lVar3 + 1;
      } while (*pxVar2 != '\0');
      pxVar2 = xmlStrncat(cur,add,(int)lVar3 + -1);
      return pxVar2;
    }
    lVar3 = -1;
    do {
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (add[lVar1] != '\0');
    if (-1 < (int)(uint)lVar3) {
      __n = (ulong)((uint)lVar3 & 0x7fffffff);
      pxVar2 = (xmlChar *)(*xmlMalloc)(__n + 1);
      if (pxVar2 != (xmlChar *)0x0) {
        memcpy(pxVar2,add,__n);
        pxVar2[__n] = '\0';
        return pxVar2;
      }
    }
    cur = (xmlChar *)0x0;
  }
  return cur;
}

Assistant:

xmlChar *
xmlStrcat(xmlChar *cur, const xmlChar *add) {
    const xmlChar *p = add;

    if (add == NULL) return(cur);
    if (cur == NULL)
        return(xmlStrdup(add));

    while (*p != 0) p++; /* non input consuming */
    return(xmlStrncat(cur, add, p - add));
}